

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

void google::protobuf::StrAppend(string *result,AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d)

{
  reference pcVar1;
  AlphaNum *pAVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  LogMessage *pLVar6;
  LogFinisher local_19a;
  byte local_199;
  LogMessage local_198;
  char *local_160;
  char *out;
  reference local_150;
  char *begin;
  size_type old_size;
  LogMessage local_138;
  LogFinisher local_fa;
  byte local_f9;
  LogMessage local_f8;
  LogFinisher local_ba;
  byte local_b9;
  LogMessage local_b8;
  LogFinisher local_7d [20];
  byte local_69;
  LogMessage local_68;
  AlphaNum *local_30;
  AlphaNum *d_local;
  AlphaNum *c_local;
  AlphaNum *b_local;
  AlphaNum *a_local;
  string *result_local;
  
  local_30 = d;
  d_local = c;
  c_local = b;
  b_local = a;
  a_local = (AlphaNum *)result;
  pcVar3 = strings::AlphaNum::data(a);
  lVar4 = std::__cxx11::string::data();
  uVar5 = std::__cxx11::string::size();
  local_69 = 0;
  if ((ulong)((long)pcVar3 - lVar4) <= uVar5) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x643);
    local_69 = 1;
    pLVar6 = internal::LogMessage::operator<<
                       (&local_68,
                        "CHECK failed: (uintptr_t((a).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=(local_7d,pLVar6);
  }
  if ((local_69 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_68);
  }
  pcVar3 = strings::AlphaNum::data(c_local);
  lVar4 = std::__cxx11::string::data();
  uVar5 = std::__cxx11::string::size();
  local_b9 = 0;
  if ((ulong)((long)pcVar3 - lVar4) <= uVar5) {
    internal::LogMessage::LogMessage
              (&local_b8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x644);
    local_b9 = 1;
    pLVar6 = internal::LogMessage::operator<<
                       (&local_b8,
                        "CHECK failed: (uintptr_t((b).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=(&local_ba,pLVar6);
  }
  if ((local_b9 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_b8);
  }
  pcVar3 = strings::AlphaNum::data(d_local);
  lVar4 = std::__cxx11::string::data();
  uVar5 = std::__cxx11::string::size();
  local_f9 = 0;
  if ((ulong)((long)pcVar3 - lVar4) <= uVar5) {
    internal::LogMessage::LogMessage
              (&local_f8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x645);
    local_f9 = 1;
    pLVar6 = internal::LogMessage::operator<<
                       (&local_f8,
                        "CHECK failed: (uintptr_t((c).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=(&local_fa,pLVar6);
  }
  if ((local_f9 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_f8);
  }
  pcVar3 = strings::AlphaNum::data(local_30);
  lVar4 = std::__cxx11::string::data();
  uVar5 = std::__cxx11::string::size();
  old_size._7_1_ = 0;
  if ((ulong)((long)pcVar3 - lVar4) <= uVar5) {
    internal::LogMessage::LogMessage
              (&local_138,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x646);
    old_size._7_1_ = 1;
    pLVar6 = internal::LogMessage::operator<<
                       (&local_138,
                        "CHECK failed: (uintptr_t((d).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=((LogFinisher *)((long)&old_size + 6),pLVar6);
  }
  if ((old_size._7_1_ & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_138);
  }
  begin = (char *)std::__cxx11::string::size();
  pAVar2 = a_local;
  strings::AlphaNum::size(b_local);
  strings::AlphaNum::size(c_local);
  strings::AlphaNum::size(d_local);
  strings::AlphaNum::size(local_30);
  std::__cxx11::string::resize((ulong)pAVar2);
  out = (char *)std::__cxx11::string::begin();
  local_150 = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&out);
  pcVar3 = Append4(local_150 + (long)begin,b_local,c_local,d_local,local_30);
  pcVar1 = local_150;
  local_160 = pcVar3;
  lVar4 = std::__cxx11::string::size();
  local_199 = 0;
  if (pcVar3 != pcVar1 + lVar4) {
    internal::LogMessage::LogMessage
              (&local_198,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x64b);
    local_199 = 1;
    pLVar6 = internal::LogMessage::operator<<
                       (&local_198,"CHECK failed: (out) == (begin + result->size()): ");
    internal::LogFinisher::operator=(&local_19a,pLVar6);
  }
  if ((local_199 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_198);
  }
  return;
}

Assistant:

void StrAppend(std::string *result, const AlphaNum &a, const AlphaNum &b,
               const AlphaNum &c, const AlphaNum &d) {
  GOOGLE_DCHECK_NO_OVERLAP(*result, a);
  GOOGLE_DCHECK_NO_OVERLAP(*result, b);
  GOOGLE_DCHECK_NO_OVERLAP(*result, c);
  GOOGLE_DCHECK_NO_OVERLAP(*result, d);
  std::string::size_type old_size = result->size();
  result->resize(old_size + a.size() + b.size() + c.size() + d.size());
  char *const begin = &*result->begin();
  char *out = Append4(begin + old_size, a, b, c, d);
  GOOGLE_DCHECK_EQ(out, begin + result->size());
}